

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5TextureGatherOffset.cpp
# Opt level: O0

bool __thiscall
glcts::GPUShader5TextureGatherOffsetColor2DOffsetsCaseTest::checkResult
          (GPUShader5TextureGatherOffsetColor2DOffsetsCaseTest *this,CapturedVaryings *captured_data
          ,uint index,uint tex_size)

{
  TestLog *pTVar1;
  MessageBuilder *pMVar2;
  MessageBuilder local_450;
  MessageBuilder local_2d0;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_111;
  string local_110;
  LogSection local_f0;
  uint local_b0;
  uint local_ac;
  uint i_2;
  uint i_1;
  GLint expected_values_3 [4];
  GLint expected_values_2 [4];
  GLint expected_values_1 [4];
  GLint expected_values_0 [4];
  uint local_5c;
  GLint local_58;
  uint i;
  GLint y_offsets [4];
  GLint x_offsets [4];
  uint local_2c;
  uint local_28;
  GLint texture_size;
  uint tex_size_local;
  uint index_local;
  CapturedVaryings *captured_data_local;
  GPUShader5TextureGatherOffsetColor2DOffsetsCaseTest *this_local;
  
  y_offsets[2] = (this->super_GPUShader5TextureGatherOffsetColorTestBase).
                 super_GPUShader5TextureGatherOffsetTestBase.m_min_texture_gather_offset;
  y_offsets[3] = (this->super_GPUShader5TextureGatherOffsetColorTestBase).
                 super_GPUShader5TextureGatherOffsetTestBase.m_min_texture_gather_offset;
  x_offsets[0] = (this->super_GPUShader5TextureGatherOffsetColorTestBase).
                 super_GPUShader5TextureGatherOffsetTestBase.m_max_texture_gather_offset;
  x_offsets[1] = (this->super_GPUShader5TextureGatherOffsetColorTestBase).
                 super_GPUShader5TextureGatherOffsetTestBase.m_max_texture_gather_offset;
  local_58 = (this->super_GPUShader5TextureGatherOffsetColorTestBase).
             super_GPUShader5TextureGatherOffsetTestBase.m_min_texture_gather_offset;
  i = (this->super_GPUShader5TextureGatherOffsetColorTestBase).
      super_GPUShader5TextureGatherOffsetTestBase.m_max_texture_gather_offset;
  y_offsets[0] = (this->super_GPUShader5TextureGatherOffsetColorTestBase).
                 super_GPUShader5TextureGatherOffsetTestBase.m_min_texture_gather_offset;
  y_offsets[1] = (this->super_GPUShader5TextureGatherOffsetColorTestBase).
                 super_GPUShader5TextureGatherOffsetTestBase.m_max_texture_gather_offset;
  for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
    if (y_offsets[(ulong)local_5c + 2] < 0) {
      y_offsets[(ulong)local_5c + 2] = y_offsets[(ulong)local_5c + 2] % (int)tex_size;
      y_offsets[(ulong)local_5c + 2] = tex_size + y_offsets[(ulong)local_5c + 2];
    }
    if ((&local_58)[local_5c] < 0) {
      (&local_58)[local_5c] = (&local_58)[local_5c] % (int)tex_size;
      (&local_58)[local_5c] = tex_size + (&local_58)[local_5c];
    }
  }
  for (local_ac = 0; local_ac < 4; local_ac = local_ac + 1) {
    expected_values_1[(ulong)local_ac + 2] =
         (y_offsets[(ulong)local_ac + 2] + captured_data->without_offset_0[3]) % (int)tex_size;
    expected_values_2[(ulong)local_ac + 2] =
         ((&local_58)[local_ac] + captured_data->without_offset_1[3]) % (int)tex_size;
    expected_values_3[(ulong)local_ac + 2] =
         (y_offsets[(ulong)local_ac + 2] + captured_data->without_offset_2[3]) % (int)tex_size;
    (&i_2)[local_ac] = ((&local_58)[local_ac] + captured_data->without_offset_3[3]) % (int)tex_size;
  }
  local_b0 = 0;
  while( true ) {
    if (3 < local_b0) {
      return true;
    }
    if ((((captured_data->with_offset_0[local_b0] != expected_values_1[(ulong)local_b0 + 2]) ||
         (captured_data->with_offset_1[local_b0] != expected_values_2[(ulong)local_b0 + 2])) ||
        (captured_data->with_offset_2[local_b0] != expected_values_3[(ulong)local_b0 + 2])) ||
       (captured_data->with_offset_3[local_b0] != (&i_2)[local_b0])) break;
    local_b0 = local_b0 + 1;
  }
  local_2c = tex_size;
  local_28 = tex_size;
  texture_size = index;
  _tex_size_local = captured_data;
  captured_data_local = (CapturedVaryings *)this;
  pTVar1 = tcu::TestContext::getLog
                     ((this->super_GPUShader5TextureGatherOffsetColorTestBase).
                      super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
                      super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"Invalid result",&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"",&local_149);
  tcu::LogSection::LogSection(&local_f0,&local_110,&local_148);
  tcu::TestLog::operator<<(pTVar1,&local_f0);
  tcu::LogSection::~LogSection(&local_f0);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  GPUShader5TextureGatherOffsetTestBase::logCoordinates
            ((GPUShader5TextureGatherOffsetTestBase *)this,texture_size);
  pTVar1 = tcu::TestContext::getLog
                     ((this->super_GPUShader5TextureGatherOffsetColorTestBase).
                      super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_2d0,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_2d0,(char (*) [15])"Texture size: ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(int *)&local_2c);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_2d0);
  pTVar1 = tcu::TestContext::getLog
                     ((this->super_GPUShader5TextureGatherOffsetColorTestBase).
                      super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_450,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_450,(char (*) [10])"Offsets: ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2b0b32f);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,y_offsets + 2);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a4b1eb);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_58);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2b56371);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2b0b32f);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,y_offsets + 3);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a4b1eb);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(int *)&i);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2b56371);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2b0b32f);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,x_offsets);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a4b1eb);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,y_offsets);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2b56371);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2b0b32f);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,x_offsets + 1);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a4b1eb);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,y_offsets + 1);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2b56371);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_450);
  GPUShader5TextureGatherOffsetColorTestBase::logVaryings
            (&this->super_GPUShader5TextureGatherOffsetColorTestBase,_tex_size_local);
  pTVar1 = tcu::TestContext::getLog
                     ((this->super_GPUShader5TextureGatherOffsetColorTestBase).
                      super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(pTVar1,(EndSectionToken *)&tcu::TestLog::EndSection);
  return false;
}

Assistant:

bool GPUShader5TextureGatherOffsetColor2DOffsetsCaseTest::checkResult(const CapturedVaryings& captured_data,
																	  unsigned int index, unsigned int tex_size)
{
	/* Signed int value has to be used with operator % in order to work as expected */
	const glw::GLint texture_size = (glw::GLint)tex_size;

	/* X and Y offsets */
	glw::GLint x_offsets[m_n_components_per_varying] = {
		m_min_texture_gather_offset, m_min_texture_gather_offset, m_max_texture_gather_offset,
		m_max_texture_gather_offset,
	};

	glw::GLint y_offsets[m_n_components_per_varying] = {
		m_min_texture_gather_offset, m_max_texture_gather_offset, m_min_texture_gather_offset,
		m_max_texture_gather_offset,
	};

	for (unsigned int i = 0; i < m_n_components_per_varying; ++i)
	{
		/* Roll x offsets around left edge when negative */
		if (0 > x_offsets[i])
		{
			x_offsets[i] = x_offsets[i] % texture_size;
			x_offsets[i] += texture_size;
		}

		/* Roll y offsets around top edge when negative */
		if (0 > y_offsets[i])
		{
			y_offsets[i] = y_offsets[i] % texture_size;
			y_offsets[i] += texture_size;
		}
	}

	/* Storage for expected values of with_offset varyings */
	glw::GLint expected_values_0[m_n_components_per_varying];
	glw::GLint expected_values_1[m_n_components_per_varying];
	glw::GLint expected_values_2[m_n_components_per_varying];
	glw::GLint expected_values_3[m_n_components_per_varying];

	/* Calculate expected values of with_offset varyings */
	for (unsigned int i = 0; i < m_n_components_per_varying; ++i)
	{
		expected_values_0[i] = ((x_offsets[i] + captured_data.without_offset_0[3]) % texture_size);
		expected_values_1[i] = ((y_offsets[i] + captured_data.without_offset_1[3]) % texture_size);
		expected_values_2[i] = ((x_offsets[i] + captured_data.without_offset_2[3]) % texture_size);
		expected_values_3[i] = ((y_offsets[i] + captured_data.without_offset_3[3]) % texture_size);
	}

	/* Verify that expected_values match those in with_offset varyings */
	for (unsigned int i = 0; i < m_n_components_per_varying; ++i)
	{
		if ((captured_data.with_offset_0[i] != expected_values_0[i]) ||
			(captured_data.with_offset_1[i] != expected_values_1[i]) ||
			(captured_data.with_offset_2[i] != expected_values_2[i]) ||
			(captured_data.with_offset_3[i] != expected_values_3[i]))
		{
			/* Log invalid results */
			m_testCtx.getLog() << tcu::TestLog::Section("Invalid result", "");

			logCoordinates(index);

			m_testCtx.getLog() << tcu::TestLog::Message << "Texture size: " << texture_size << tcu::TestLog::EndMessage;

			m_testCtx.getLog() << tcu::TestLog::Message << "Offsets: "
							   << "(" << x_offsets[0] << ", " << y_offsets[0] << ") "
							   << "(" << x_offsets[1] << ", " << y_offsets[1] << ") "
							   << "(" << x_offsets[2] << ", " << y_offsets[2] << ") "
							   << "(" << x_offsets[3] << ", " << y_offsets[3] << ") " << tcu::TestLog::EndMessage;

			logVaryings(captured_data);

			m_testCtx.getLog() << tcu::TestLog::EndSection;

			/* Done */
			return false;
		}
	}

	/* Done */
	return true;
}